

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_resize.c
# Opt level: O0

int cvBuildNordsieckArrayBDF
              (sunrealtype *t,N_Vector *y,N_Vector f,N_Vector *wrk,int order,sunrealtype hscale,
              N_Vector *zn)

{
  undefined8 *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  double *in_RDI;
  int in_R8D;
  undefined8 *in_R9;
  double in_XMM0_Qa;
  double dVar1;
  int i_7;
  sunrealtype scale;
  int j_1;
  int i_6;
  int i_5;
  sunrealtype delta_t;
  int j;
  int i_4;
  int i_3;
  int i_2;
  sunrealtype t_ext [6];
  int i_1;
  int i;
  int local_ac;
  double local_a8;
  int local_9c;
  int local_98;
  int local_94;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  double local_78 [6];
  int local_48;
  int local_44;
  undefined8 *local_40;
  double local_38;
  int local_2c;
  undefined8 *local_28;
  long local_20;
  undefined8 *local_18;
  double *local_10;
  int local_4;
  
  if (((((in_RDI == (double *)0x0) || (in_RSI == (undefined8 *)0x0)) || (in_RDX == 0)) ||
      ((in_RCX == (undefined8 *)0x0 || (in_R8D < 1)))) || (in_R9 == (undefined8 *)0x0)) {
    local_4 = -0x16;
  }
  else {
    for (local_44 = 0; local_44 < in_R8D; local_44 = local_44 + 1) {
      if (in_RSI[local_44] == 0) {
        return -0x16;
      }
    }
    for (local_48 = 0; local_48 < in_R8D + 1; local_48 = local_48 + 1) {
      if (in_RCX[local_48] == 0) {
        return -0x16;
      }
    }
    local_40 = in_R9;
    local_38 = in_XMM0_Qa;
    local_2c = in_R8D;
    local_20 = in_RDX;
    local_18 = in_RSI;
    if (1 < in_R8D) {
      local_78[0] = *in_RDI;
      local_28 = in_RCX;
      local_10 = in_RDI;
      for (local_7c = 1; local_7c <= local_2c; local_7c = local_7c + 1) {
        local_78[local_7c] = local_10[local_7c + -1];
      }
      N_VScale(0x3ff0000000000000,*local_18,*local_28);
      for (local_80 = 1; local_80 <= local_2c; local_80 = local_80 + 1) {
        N_VScale(0x3ff0000000000000,local_18[local_80 + -1],local_28[local_80]);
      }
      for (local_84 = 1; local_84 <= local_2c; local_84 = local_84 + 1) {
        for (local_88 = local_2c; local_84 + -1 < local_88; local_88 = local_88 + -1) {
          if ((local_84 == 1) && (local_88 == 1)) {
            N_VScale(0x3ff0000000000000,local_20,local_28[1]);
          }
          else {
            dVar1 = 1.0 / (local_78[local_88 - local_84] - local_78[local_88]);
            N_VLinearSum(dVar1,-dVar1,local_28[local_88 + -1],local_28[local_88],local_28[local_88])
            ;
          }
        }
      }
      N_VScale(0x3ff0000000000000,local_28[local_2c],*local_40);
      for (local_94 = 1; local_98 = local_2c, local_94 <= local_2c; local_94 = local_94 + 1) {
        N_VConst(0,local_40[local_94]);
      }
      while (local_98 = local_98 + -1, -1 < local_98) {
        for (local_9c = local_2c; 0 < local_9c; local_9c = local_9c + -1) {
          N_VLinearSum(local_78[0] - local_78[local_98],(double)local_9c,local_40[local_9c],
                       local_40[local_9c + -1],local_40[local_9c]);
        }
        N_VLinearSum(local_78[0] - local_78[local_98],0x3ff0000000000000,*local_40,
                     local_28[local_98],*local_40);
      }
    }
    N_VScale(0x3ff0000000000000,*local_18,*local_40);
    N_VScale(0x3ff0000000000000,local_20,local_40[1]);
    local_a8 = 1.0;
    for (local_ac = 1; local_ac <= local_2c; local_ac = local_ac + 1) {
      local_a8 = (local_38 / (double)local_ac) * local_a8;
      N_VScale(local_a8,local_40[local_ac],local_40[local_ac]);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int cvBuildNordsieckArrayBDF(sunrealtype* t, N_Vector* y, N_Vector f,
                                    N_Vector* wrk, int order,
                                    sunrealtype hscale, N_Vector* zn)
{
  /* Check for valid inputs */
  if (!t || !y || !f || !wrk || order < 1 || !zn) { return CV_ILL_INPUT; }

  for (int i = 0; i < order; i++)
  {
    if (!y[i]) { return CV_ILL_INPUT; }
  }

  for (int i = 0; i < order + 1; i++)
  {
    if (!wrk[i]) { return CV_ILL_INPUT; }
  }

  /* Compute Nordsieck array */
  if (order > 1)
  {
    /* Setup extended array of times to incorporate derivative value */
    sunrealtype t_ext[BDF_Q_MAX + 1];

    t_ext[0] = t[0];
    for (int i = 1; i <= order; i++) { t_ext[i] = t[i - 1]; }

    /* Compute Hermite polynomial coefficients interpolating y history and f */
    N_VScale(ONE, y[0], wrk[0]);
    for (int i = 1; i <= order; i++) { N_VScale(ONE, y[i - 1], wrk[i]); }

    for (int i = 1; i <= order; i++)
    {
      for (int j = order; j > i - 1; j--)
      {
        if (i == 1 && j == 1)
        {
          /* Replace with actual derivative value */
          N_VScale(ONE, f, wrk[j]);
        }
        else
        {
          /* Divided difference */
          sunrealtype delta_t = ONE / (t_ext[j - i] - t_ext[j]);
          N_VLinearSum(delta_t, wrk[j - 1], -delta_t, wrk[j], wrk[j]);
        }
      }
    }

    /* Compute derivatives of Hermite polynomial */
    N_VScale(ONE, wrk[order], zn[0]);
    for (int i = 1; i <= order; i++) { N_VConst(ZERO, zn[i]); }

    for (int i = order - 1; i >= 0; i--)
    {
      for (int j = order; j > 0; j--)
      {
        N_VLinearSum(t_ext[0] - t_ext[i], zn[j], j, zn[j - 1], zn[j]);
      }
      N_VLinearSum(t_ext[0] - t_ext[i], zn[0], ONE, wrk[i], zn[0]);
    }
  }

  /* Overwrite first two columns with input values */
  N_VScale(ONE, y[0], zn[0]);
  N_VScale(ONE, f, zn[1]);

  /* Scale entries */
  sunrealtype scale = ONE;
  for (int i = 1; i <= order; i++)
  {
    scale *= hscale / ((sunrealtype)i);
    N_VScale(scale, zn[i], zn[i]);
  }

  return CV_SUCCESS;
}